

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgDmaStart(uchar *mem,uint count)

{
  uint local_20;
  uint local_1c;
  uint err;
  uint count_local;
  uchar *mem_local;
  
  if (((ZvgIO.ecpFlags & 1) != 0) || (mem_local._4_4_ = zvgSetEcpMode(), mem_local._4_4_ == 0)) {
    local_20 = 0;
    _err = mem;
    for (local_1c = count; local_20 == 0 && local_1c != 0; local_1c = local_1c - 1) {
      local_20 = zvgEcpPutc(*_err);
      _err = _err + 1;
    }
    if (local_20 == 0x15) {
      compatibility();
    }
    mem_local._4_4_ = local_20;
  }
  return mem_local._4_4_;
}

Assistant:

static uint zvgDmaStart( uchar *mem, uint count)
{
	uint	err;

	// make sure we're in the ECP mode

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
	{	err = zvgSetEcpMode();										// set to ECP mode

		if (err)
			return (err);												// if error, return
	}

	err = errOk;

	// loop through buffer sending bytes to the ZVG

	while (!err && count > 0)
	{	err = zvgEcpPutc( *mem);
		mem++;
		count--;
	}
	if (err == errEcpTimeout)
		compatibility();												// if timeout, force compatibility mode

	return (err);
}